

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

mat<double,_3,_3> * __thiscall
linalg::inverse<double,3>
          (mat<double,_3,_3> *__return_storage_ptr__,linalg *this,mat<double,_3,_3> *a)

{
  double dVar1;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  adjugate<double>((mat<double,_3,_3> *)this);
  dVar1 = (*(double *)(this + 0x18) * *(double *)(this + 0x38) -
          *(double *)(this + 0x20) * *(double *)(this + 0x30)) * *(double *)(this + 0x10) +
          (*(double *)(this + 0x20) * *(double *)(this + 0x40) -
          *(double *)(this + 0x28) * *(double *)(this + 0x38)) * *(double *)this +
          (*(double *)(this + 0x28) * *(double *)(this + 0x30) -
          *(double *)(this + 0x40) * *(double *)(this + 0x18)) * *(double *)(this + 8);
  (__return_storage_ptr__->x).x = local_60 / dVar1;
  (__return_storage_ptr__->x).y = local_58 / dVar1;
  (__return_storage_ptr__->x).z = local_50 / dVar1;
  (__return_storage_ptr__->y).x = local_48 / dVar1;
  (__return_storage_ptr__->y).y = local_40 / dVar1;
  (__return_storage_ptr__->y).z = local_38 / dVar1;
  (__return_storage_ptr__->z).x = local_30 / dVar1;
  (__return_storage_ptr__->z).y = local_28 / dVar1;
  (__return_storage_ptr__->z).z = local_20 / dVar1;
  return __return_storage_ptr__;
}

Assistant:

T * begin(      vec<T,M> & a) { return &a.x; }